

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O3

void __thiscall
ADE_DEP_DPFSP::LS1EXC
          (ADE_DEP_DPFSP *this,Permutazione *p,uint iF,int *indiciFabbriche,uint *cFabbriche)

{
  unsigned_short uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  unsigned_short *risultato;
  unsigned_short *puVar5;
  bool bVar6;
  ushort uVar7;
  unsigned_short uVar8;
  ulong uVar9;
  ushort d;
  uint uVar10;
  ushort uVar11;
  ushort uVar12;
  ulong uVar13;
  IndiciRandom indRand;
  ushort local_9e;
  ushort local_9c;
  IndiciRandom local_48;
  
  uVar10 = (indiciFabbriche[iF + 1] - indiciFabbriche[iF]) + 1;
  local_48.vettoreIndici = (unsigned_short *)0x3200000002;
  uVar3 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_48,&genRand.gen,(param_type *)&local_48
                    );
  d = (ushort)uVar10;
  if (d < (ushort)uVar3) {
    uVar3 = uVar10;
  }
  uVar10 = uVar3 & 0xffff;
  risultato = (unsigned_short *)operator_new__((ulong)(uVar10 * 2));
  IndiciRandom::IndiciRandom(&local_48,&genRand,d);
  uVar8 = (unsigned_short)uVar3;
  IndiciRandom::generaIndici(&local_48,risultato,uVar8);
  if (1 < uVar8) {
    uVar3 = (uint)(ushort)cFabbriche[iF >> 1];
    uVar9 = 1;
    bVar6 = false;
    uVar11 = 0;
    do {
      uVar7 = uVar11 + 1;
      if (uVar7 < uVar8) {
        uVar11 = risultato[uVar11] + (short)indiciFabbriche[iF];
        uVar13 = uVar9 & 0xffff;
        puVar5 = p->individuo;
        do {
          iVar2 = indiciFabbriche[iF];
          uVar12 = risultato[uVar13] + (short)iVar2;
          uVar1 = puVar5[uVar11];
          puVar5[uVar11] = puVar5[uVar12];
          puVar5[uVar12] = uVar1;
          uVar4 = valutaIndividuoParziale(this,puVar5 + iVar2,d);
          if ((uVar4 & 0xffff) < (uVar3 & 0xffff)) {
            bVar6 = true;
            uVar3 = uVar4;
            local_9e = uVar11;
            local_9c = uVar12;
          }
          puVar5 = p->individuo;
          uVar1 = puVar5[uVar11];
          puVar5[uVar11] = puVar5[uVar12];
          puVar5[uVar12] = uVar1;
          uVar13 = uVar13 + 1;
        } while (uVar13 < uVar10);
      }
      uVar9 = (ulong)((int)uVar9 + 1);
      uVar11 = uVar7;
    } while ((int)(uint)uVar7 < (int)(uVar10 - 1));
    if (bVar6) {
      puVar5 = p->individuo;
      uVar8 = puVar5[local_9e];
      puVar5[local_9e] = puVar5[local_9c];
      puVar5[local_9c] = uVar8;
      cFabbriche[iF >> 1] = uVar3 & 0xffff;
    }
  }
  operator_delete__(risultato);
  IndiciRandom::~IndiciRandom(&local_48);
  return;
}

Assistant:

void ADE_DEP_DPFSP::LS1EXC(Permutazione* p, unsigned int iF, int* indiciFabbriche, unsigned int* cFabbriche) {
	
	unsigned short dimensioneFabbrica = indiciFabbriche[iF + 1] - indiciFabbriche[iF] + 1;

	unsigned short  posizioniDaSelezionare = min(dimensioneFabbrica, (unsigned short)genRand.randIntU(2, 50));

	unsigned short* indici = new unsigned short[posizioniDaSelezionare];
	
	IndiciRandom indRand(&genRand, dimensioneFabbrica);

	indRand.generaIndici(indici, posizioniDaSelezionare);

	bool miglioramento = false;
	unsigned short miglioreIndice1, miglioreIndice2, nuovoCosto, miglioreCosto = cFabbriche[iF / 2],
		indice1, indice2, tmp;

	for (unsigned short i = 0; i < posizioniDaSelezionare - 1; i++) {
		indice1 = indiciFabbriche[iF] + indici[i];

		for (unsigned short j = i + 1; j < posizioniDaSelezionare; j++) {
			indice2 = indiciFabbriche[iF] + indici[j];

			tmp = p->individuo[indice1];
			p->individuo[indice1] = p->individuo[indice2];
			p->individuo[indice2] = tmp;

			nuovoCosto = valutaIndividuoParziale(&p->individuo[indiciFabbriche[iF]], dimensioneFabbrica);
			if (nuovoCosto < miglioreCosto) {
				miglioreCosto = nuovoCosto;
				miglioreIndice1 = indice1;
				miglioreIndice2 = indice2;
				miglioramento = true;
			}

			tmp = p->individuo[indice1];
			p->individuo[indice1] = p->individuo[indice2];
			p->individuo[indice2] = tmp;
		}
	}

	if (miglioramento) {
		tmp = p->individuo[miglioreIndice1];
		p->individuo[miglioreIndice1] = p->individuo[miglioreIndice2];
		p->individuo[miglioreIndice2] = tmp;

		cFabbriche[iF / 2] = miglioreCosto;
	}

	delete[] indici;
}